

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O1

REF_STATUS ref_collapse_edge(REF_GRID ref_grid,REF_INT node0,REF_INT node1)

{
  REF_CELL pRVar1;
  REF_INT RVar2;
  REF_INT RVar3;
  uint uVar4;
  undefined8 uVar5;
  char *pcVar6;
  long lVar7;
  REF_INT ncell;
  REF_INT cell_to_collapse [100];
  int local_1dc;
  REF_INT local_1d8;
  REF_INT local_1d4;
  REF_GRID local_1d0;
  REF_INT local_1c8 [102];
  
  pRVar1 = ref_grid->cell[8];
  uVar4 = ref_cell_list_with2(pRVar1,node0,node1,100,&local_1dc,local_1c8);
  if (uVar4 == 0) {
    local_1d8 = node0;
    local_1d4 = node1;
    local_1d0 = ref_grid;
    if (0 < local_1dc) {
      lVar7 = 0;
      do {
        uVar4 = ref_cell_remove(pRVar1,local_1c8[lVar7]);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x152,"ref_collapse_edge",(ulong)uVar4,"remove");
          return uVar4;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < local_1dc);
    }
    RVar3 = local_1d4;
    RVar2 = local_1d8;
    uVar4 = ref_cell_replace_node(pRVar1,local_1d4,local_1d8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
             0x154,"ref_collapse_edge",(ulong)uVar4,"replace node");
      return uVar4;
    }
    pRVar1 = local_1d0->cell[3];
    uVar4 = ref_cell_list_with2(pRVar1,RVar2,RVar3,100,&local_1dc,local_1c8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
             0x159,"ref_collapse_edge",(ulong)uVar4,"lst");
      return uVar4;
    }
    if (0 < local_1dc) {
      lVar7 = 0;
      do {
        uVar4 = ref_cell_remove(pRVar1,local_1c8[lVar7]);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x15d,"ref_collapse_edge",(ulong)uVar4,"remove");
          return uVar4;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < local_1dc);
    }
    RVar3 = local_1d4;
    RVar2 = local_1d8;
    uVar4 = ref_cell_replace_node(pRVar1,local_1d4,local_1d8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
             0x15f,"ref_collapse_edge",(ulong)uVar4,"replace node");
      return uVar4;
    }
    pRVar1 = local_1d0->cell[0];
    uVar4 = ref_cell_list_with2(pRVar1,RVar2,RVar3,100,&local_1dc,local_1c8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
             0x164,"ref_collapse_edge",(ulong)uVar4,"lst");
      return uVar4;
    }
    if (0 < local_1dc) {
      lVar7 = 0;
      do {
        uVar4 = ref_cell_remove(pRVar1,local_1c8[lVar7]);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x168,"ref_collapse_edge",(ulong)uVar4,"remove");
          return uVar4;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < local_1dc);
    }
    RVar2 = local_1d4;
    uVar4 = ref_cell_replace_node(pRVar1,local_1d4,local_1d8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
             0x16a,"ref_collapse_edge",(ulong)uVar4,"replace node");
      return uVar4;
    }
    uVar4 = ref_node_remove(local_1d0->node,RVar2);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
             0x16c,"ref_collapse_edge",(ulong)uVar4,"rm");
      return uVar4;
    }
    uVar4 = ref_geom_remove_all(local_1d0->geom,RVar2);
    if (uVar4 == 0) {
      return 0;
    }
    pcVar6 = "rm";
    uVar5 = 0x16d;
  }
  else {
    pcVar6 = "lst";
    uVar5 = 0x14e;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",uVar5,
         "ref_collapse_edge",(ulong)uVar4,pcVar6);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge(REF_GRID ref_grid, REF_INT node0,
                                     REF_INT node1)
/*                               keep node0,  remove node1 */
{
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT ncell, cell_in_list;
  REF_INT cell_to_collapse[MAX_CELL_COLLAPSE];

  ref_cell = ref_grid_tet(ref_grid);
  RSS(ref_cell_list_with2(ref_cell, node0, node1, MAX_CELL_COLLAPSE, &ncell,
                          cell_to_collapse),
      "lst");

  for (cell_in_list = 0; cell_in_list < ncell; cell_in_list++) {
    cell = cell_to_collapse[cell_in_list];
    RSS(ref_cell_remove(ref_cell, cell), "remove");
  }
  RSS(ref_cell_replace_node(ref_cell, node1, node0), "replace node");

  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_list_with2(ref_cell, node0, node1, MAX_CELL_COLLAPSE, &ncell,
                          cell_to_collapse),
      "lst");

  for (cell_in_list = 0; cell_in_list < ncell; cell_in_list++) {
    cell = cell_to_collapse[cell_in_list];
    RSS(ref_cell_remove(ref_cell, cell), "remove");
  }
  RSS(ref_cell_replace_node(ref_cell, node1, node0), "replace node");

  ref_cell = ref_grid_edg(ref_grid);
  RSS(ref_cell_list_with2(ref_cell, node0, node1, MAX_CELL_COLLAPSE, &ncell,
                          cell_to_collapse),
      "lst");

  for (cell_in_list = 0; cell_in_list < ncell; cell_in_list++) {
    cell = cell_to_collapse[cell_in_list];
    RSS(ref_cell_remove(ref_cell, cell), "remove");
  }
  RSS(ref_cell_replace_node(ref_cell, node1, node0), "replace node");

  RSS(ref_node_remove(ref_grid_node(ref_grid), node1), "rm");
  RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), node1), "rm");

  return REF_SUCCESS;
}